

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.h
# Opt level: O1

void __thiscall
mvm::disassembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer>::
parse<unsigned_int,4ul,mvm::num::little_endian_tag>
          (disassembler<(anonymous_namespace)::mini_set,mvm::bytecode_serializer> *this,
          string *instr)

{
  uint __val;
  long lVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  undefined8 *puVar5;
  uint uVar6;
  string __str;
  long *local_40;
  uint local_38;
  long local_30 [2];
  
  lVar1 = *(long *)(this + 8);
  ip::increment((ip *)this,4);
  if ((*(ulong *)(this + 8) < *(ulong *)(this + 0x10)) ||
     (*(ulong *)(this + 0x18) < *(ulong *)(this + 8))) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"[-][mvm] bytecode overflow","");
    *puVar5 = &PTR__mexcept_0011dcf8;
    *(undefined2 *)(puVar5 + 1) = 6;
    __cxa_throw(puVar5,&mexcept::typeinfo,mexcept::~mexcept);
  }
  __val = *(uint *)(lVar1 + 1);
  cVar4 = '\x01';
  if (9 < __val) {
    uVar6 = __val;
    cVar3 = '\x04';
    do {
      cVar4 = cVar3;
      if (uVar6 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001159ec;
      }
      if (uVar6 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001159ec;
      }
      if (uVar6 < 10000) goto LAB_001159ec;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar4 + '\x04';
    } while (bVar2);
    cVar4 = cVar4 + '\x01';
  }
LAB_001159ec:
  local_40 = local_30;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_40,local_38,__val);
  std::__cxx11::string::_M_append((char *)instr,(ulong)local_40);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void disassembler<Set, MetaCodeImpl>::parse(std::string &instr) {
  uint8_t *ip = m_rebased_ip;
  m_rebased_ip += N;

  if (!m_rebased_ip.assert_in_chunk()) {
    throw mexcept("[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW);
  }

  instr.append(
      std::to_string(code_impl_type{}.template parse<T, N, Endian>(ip + 1)));
}